

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O1

bool __thiscall GNUmakeTokenPoolPosix::ReturnToken(GNUmakeTokenPoolPosix *this)

{
  ssize_t sVar1;
  int *piVar2;
  byte unaff_BPL;
  bool bVar3;
  char buf;
  undefined1 local_19;
  
  local_19 = 0x2b;
  do {
    sVar1 = write(this->wfd_,&local_19,1);
    if ((int)sVar1 < 1) {
      if ((int)sVar1 != -1) {
        unaff_BPL = false;
        goto LAB_001249de;
      }
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
      unaff_BPL = unaff_BPL & bVar3;
    }
    else {
      unaff_BPL = true;
LAB_001249de:
      bVar3 = false;
    }
    if (!bVar3) {
      return (bool)unaff_BPL;
    }
  } while( true );
}

Assistant:

bool GNUmakeTokenPoolPosix::ReturnToken() {
  const char buf = '+';
  while (1) {
    int ret = write(wfd_, &buf, 1);
    if (ret > 0)
      return true;
    if ((ret != -1) || (errno != EINTR))
      return false;
    // write got interrupted - retry
  }
}